

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Cord * __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::elements
          (RepeatedField<absl::lts_20250127::Cord> *this,bool is_soo)

{
  int iVar1;
  Cord *pCVar2;
  undefined7 in_register_00000031;
  
  iVar1 = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < iVar1) {
    if (is_soo) {
      return (Cord *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pCVar2 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    return pCVar2;
  }
  elements();
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }